

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Plan::CleanNode(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Mem_fn<bool_(Node::*)()_const> __pred;
  iterator __first;
  bool bVar1;
  bool bVar2;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar3;
  reference ppEVar4;
  pointer ppVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> __last;
  TimeStamp TVar6;
  TimeStamp TVar7;
  reference ppNVar8;
  DependencyScan *in_stack_ffffffffffffff08;
  DependencyScan *in_stack_ffffffffffffff10;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_c8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_c0;
  iterator o;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Stack_b0;
  bool outputs_dirty;
  iterator i;
  Node *most_recent_input;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  iterator end;
  iterator begin;
  _Self local_48;
  iterator want_e;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_38;
  const_iterator oe;
  string *err_local;
  Node *node_local;
  DependencyScan *scan_local;
  Plan *this_local;
  
  oe._M_current = (Edge **)err;
  Node::set_dirty(node,false);
  pvVar3 = Node::out_edges(node);
  local_38._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar3);
  do {
    pvVar3 = Node::out_edges(node);
    want_e._M_node = (_Base_ptr)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar3);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                        *)&want_e);
    if (!bVar1) {
      return true;
    }
    ppEVar4 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_38);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
         ::find(&this->want_,ppEVar4);
    begin._M_current =
         (Node **)std::
                  map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                  ::end(&this->want_);
    bVar2 = std::operator==(&local_48,(_Self *)&begin);
    bVar1 = true;
    if (!bVar2) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_48);
      bVar1 = ppVar5->second == kWantNothing;
    }
    if ((!bVar1) &&
       (ppEVar4 = __gnu_cxx::
                  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_38), ((*ppEVar4)->deps_missing_ & 1U) == 0)) {
      ppEVar4 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_38);
      end = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar4)->inputs_);
      ppEVar4 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_38);
      local_68._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar4)->inputs_);
      ppEVar4 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_38);
      __last = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
               ::operator-(&local_68,(long)(*ppEVar4)->order_only_deps_);
      __first = end;
      local_60 = __last;
      std::mem_fn<bool()const,Node>((_Mem_fn<bool_(Node::*)()_const> *)Node::dirty,0);
      __pred.super__Mem_fn_base<bool_(Node::*)()_const,_true>._8_8_ = in_stack_ffffffffffffff10;
      __pred.super__Mem_fn_base<bool_(Node::*)()_const,_true>._M_pmf =
           (offset_in_Node_to_subr)in_stack_ffffffffffffff08;
      local_70 = std::
                 find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,std::_Mem_fn<bool(Node::*)()const>>
                           (__first._M_current,__last,__pred);
      bVar1 = __gnu_cxx::operator==(&local_70,&local_60);
      if (bVar1) {
        i._M_current = (Node **)0x0;
        _Stack_b0._M_current = end._M_current;
        while (bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff50,&local_60), bVar1) {
          if (i._M_current == (Node **)0x0) {
LAB_0010f7a8:
            ppNVar8 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&stack0xffffffffffffff50);
            i._M_current = (Node **)*ppNVar8;
          }
          else {
            ppNVar8 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&stack0xffffffffffffff50);
            TVar6 = Node::mtime(*ppNVar8);
            TVar7 = Node::mtime((Node *)i._M_current);
            if (TVar7 < TVar6) goto LAB_0010f7a8;
          }
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator++(&stack0xffffffffffffff50);
        }
        o._M_current._7_1_ = 0;
        in_stack_ffffffffffffff10 = scan;
        ppEVar4 = __gnu_cxx::
                  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_38);
        bVar1 = DependencyScan::RecomputeOutputsDirty
                          (in_stack_ffffffffffffff10,*ppEVar4,(Node *)i._M_current,
                           (bool *)((long)&o._M_current + 7),(string *)oe._M_current);
        if (!bVar1) {
          return false;
        }
        if ((o._M_current._7_1_ & 1) == 0) {
          ppEVar4 = __gnu_cxx::
                    __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                    ::operator*(&local_38);
          local_c0._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar4)->outputs_);
          while( true ) {
            ppEVar4 = __gnu_cxx::
                      __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                      ::operator*(&local_38);
            local_c8._M_current =
                 (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar4)->outputs_);
            bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
            if (!bVar1) break;
            in_stack_ffffffffffffff08 = scan;
            ppNVar8 = __gnu_cxx::
                      __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                      operator*(&local_c0);
            bVar1 = CleanNode(this,in_stack_ffffffffffffff08,*ppNVar8,(string *)oe._M_current);
            if (!bVar1) {
              return false;
            }
            __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator++(&local_c0);
          }
          ppVar5 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                             (&local_48);
          ppVar5->second = kWantNothing;
          this->wanted_edges_ = this->wanted_edges_ + -1;
          ppEVar4 = __gnu_cxx::
                    __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                    ::operator*(&local_38);
          bVar1 = Edge::is_phony(*ppEVar4);
          if (!bVar1) {
            this->command_edges_ = this->command_edges_ + -1;
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_38);
  } while( true );
}

Assistant:

bool Plan::CleanNode(DependencyScan* scan, Node* node, string* err) {
  node->set_dirty(false);

  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    // Don't process edges that we don't actually want.
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end() || want_e->second == kWantNothing)
      continue;

    // Don't attempt to clean an edge if it failed to load deps.
    if ((*oe)->deps_missing_)
      continue;

    // If all non-order-only inputs for this edge are now clean,
    // we might have changed the dirty state of the outputs.
    vector<Node*>::iterator
        begin = (*oe)->inputs_.begin(),
        end = (*oe)->inputs_.end() - (*oe)->order_only_deps_;
#if __cplusplus < 201703L
#define MEM_FN mem_fun
#else
#define MEM_FN mem_fn  // mem_fun was removed in C++17.
#endif
    if (find_if(begin, end, MEM_FN(&Node::dirty)) == end) {
      // Recompute most_recent_input.
      Node* most_recent_input = NULL;
      for (vector<Node*>::iterator i = begin; i != end; ++i) {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime())
          most_recent_input = *i;
      }

      // Now, this edge is dirty if any of the outputs are dirty.
      // If the edge isn't dirty, clean the outputs and mark the edge as not
      // wanted.
      bool outputs_dirty = false;
      if (!scan->RecomputeOutputsDirty(*oe, most_recent_input,
                                       &outputs_dirty, err)) {
        return false;
      }
      if (!outputs_dirty) {
        for (vector<Node*>::iterator o = (*oe)->outputs_.begin();
             o != (*oe)->outputs_.end(); ++o) {
          if (!CleanNode(scan, *o, err))
            return false;
        }

        want_e->second = kWantNothing;
        --wanted_edges_;
        if (!(*oe)->is_phony())
          --command_edges_;
      }
    }
  }
  return true;
}